

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3ExprCodeIN(Parse *pParse,Expr *pExpr,int destIfFalse,int destIfNull)

{
  Expr *pEVar1;
  Vdbe *p;
  ExprList *pEVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int p1;
  uint uVar6;
  int iVar7;
  int iVar8;
  byte *p_00;
  Select *pSVar9;
  int *aiMap;
  CollSeq *pCVar10;
  Expr *pEVar11;
  u8 uVar12;
  Op *pOVar13;
  int *piVar14;
  uint uVar15;
  uint uVar16;
  int *piVar17;
  long lVar18;
  int *piVar19;
  ExprList_item *pEVar20;
  int rRhsHasNull;
  int regToFree;
  int iDummy;
  int local_58;
  int local_54;
  Expr *local_50;
  byte *local_48;
  uint local_3c;
  int local_38;
  int local_34;
  
  local_54 = 0;
  pEVar11 = pExpr->pLeft;
  iVar4 = sqlite3ExprCheckIN(pParse,pExpr);
  if (iVar4 != 0) {
    return;
  }
  p_00 = (byte *)exprINAffinity(pParse,pExpr);
  pEVar1 = pExpr->pLeft;
  uVar12 = pEVar1->op;
  if (uVar12 == 0xa4) {
    uVar12 = pEVar1->op2;
  }
  if (uVar12 == '\x7f') {
    pSVar9 = (pEVar1->x).pSelect;
LAB_00155436:
    uVar15 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar9->pEList)->pList->nExpr;
  }
  else {
    uVar15 = 1;
    if (uVar12 == 0xa5) {
      pSVar9 = (Select *)&pEVar1->x;
      goto LAB_00155436;
    }
  }
  aiMap = (int *)sqlite3DbMallocZero(pParse->db,(long)(int)uVar15 * 5 + 1);
  if (pParse->db->mallocFailed != '\0') goto LAB_00155b08;
  piVar19 = (int *)(ulong)uVar15;
  p = pParse->pVdbe;
  piVar14 = &local_54;
  if (destIfFalse == destIfNull) {
    piVar14 = (int *)0x0;
  }
  local_48 = p_00;
  iVar4 = sqlite3FindInIndex(pParse,pExpr,3,piVar14,aiMap);
  local_50 = pEVar11;
  iVar5 = exprCodeVector(pParse,pEVar11,&local_34);
  piVar14 = (int *)0x0;
  if (0 < (int)uVar15) {
    piVar17 = (int *)0x0;
    do {
      piVar14 = piVar17;
      if (piVar17 != (int *)(ulong)(uint)aiMap[(long)piVar17]) break;
      piVar17 = (int *)((long)piVar17 + 1);
      piVar14 = piVar19;
    } while (piVar19 != piVar17);
  }
  p1 = iVar5;
  if (((uint)piVar14 != uVar15) && (p1 = sqlite3GetTempRange(pParse,uVar15), 0 < (int)uVar15)) {
    piVar14 = (int *)0x0;
    do {
      sqlite3VdbeAddOp3(p,0x4e,iVar5 + (int)piVar14,aiMap[(long)piVar14] + p1,0);
      piVar14 = (int *)((long)piVar14 + 1);
    } while (piVar19 != piVar14);
  }
  if (iVar4 == 5) {
    pEVar2 = (pExpr->x).pList;
    pCVar10 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
    iVar4 = sqlite3VdbeMakeLabel(p);
    local_50 = (Expr *)CONCAT44(local_50._4_4_,iVar4);
    iVar4 = 0;
    if (destIfFalse != destIfNull) {
      if (pParse->nTempReg == '\0') {
        iVar4 = pParse->nMem + 1;
        pParse->nMem = iVar4;
      }
      else {
        bVar3 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar3;
        iVar4 = pParse->aTempReg[bVar3];
      }
      sqlite3VdbeAddOp3(p,0x5c,p1,p1,iVar4);
    }
    if (0 < pEVar2->nExpr) {
      pEVar20 = pEVar2->a;
      lVar18 = 0;
      do {
        iVar7 = sqlite3ExprCodeTemp(pParse,pEVar20->pExpr,&local_38);
        if ((iVar4 != 0) && (iVar8 = sqlite3ExprCanBeNull(pEVar20->pExpr), iVar8 != 0)) {
          sqlite3VdbeAddOp3(p,0x5c,iVar4,iVar7,iVar4);
        }
        if ((destIfFalse == destIfNull) && ((long)pEVar2->nExpr + -1 <= lVar18)) {
          iVar7 = sqlite3VdbeAddOp3(p,0x34,p1,destIfFalse,iVar7);
          sqlite3VdbeChangeP4(p,iVar7,(char *)pCVar10,-2);
          uVar15 = p->nOp;
          if (0 < (int)uVar15) {
            bVar3 = *local_48 | 0x10;
LAB_00155a17:
            p->aOp[(ulong)uVar15 - 1].p5 = (short)(char)bVar3;
          }
        }
        else {
          iVar7 = sqlite3VdbeAddOp3(p,0x35,p1,(uint)local_50,iVar7);
          sqlite3VdbeChangeP4(p,iVar7,(char *)pCVar10,-2);
          uVar15 = p->nOp;
          if (0 < (int)uVar15) {
            bVar3 = *local_48;
            goto LAB_00155a17;
          }
        }
        if (local_38 != 0) {
          bVar3 = pParse->nTempReg;
          if ((ulong)bVar3 < 8) {
            pParse->nTempReg = bVar3 + 1;
            pParse->aTempReg[bVar3] = local_38;
          }
        }
        lVar18 = lVar18 + 1;
        pEVar20 = pEVar20 + 1;
      } while (lVar18 < pEVar2->nExpr);
    }
    if (iVar4 != 0) {
      sqlite3VdbeAddOp3(p,0x32,iVar4,destIfNull,0);
      sqlite3VdbeAddOp3(p,0xb,0,destIfFalse,0);
    }
    piVar14 = p->pParse->aLabel;
    if (piVar14 != (int *)0x0) {
      piVar14[(int)~(uint)local_50] = p->nOp;
    }
    if (iVar4 != 0) {
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar4;
      }
    }
  }
  else {
    local_3c = 0;
    uVar6 = destIfFalse;
    if (destIfFalse != destIfNull) {
      local_3c = sqlite3VdbeMakeLabel(p);
      uVar6 = local_3c;
    }
    if (0 < (int)uVar15) {
      uVar16 = 0;
      do {
        pEVar11 = sqlite3VectorFieldSubexpr(pExpr->pLeft,uVar16);
        iVar7 = sqlite3ExprCanBeNull(pEVar11);
        if (iVar7 != 0) {
          sqlite3VdbeAddOp3(p,0x32,p1 + uVar16,uVar6,0);
        }
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    if (iVar4 == 1) {
      sqlite3VdbeAddOp3(p,0x1e,pExpr->iTable,destIfFalse,p1);
      local_58 = sqlite3VdbeAddOp3(p,0xb,0,0,0);
    }
    else {
      iVar4 = sqlite3VdbeAddOp3(p,0x5b,p1,uVar15,0);
      sqlite3VdbeChangeP4(p,iVar4,(char *)local_48,uVar15);
      if (destIfFalse == destIfNull) {
        iVar4 = sqlite3VdbeAddOp3(p,0x1c,pExpr->iTable,destIfFalse,p1);
        if (p->db->mallocFailed == '\0') {
          pOVar13 = p->aOp;
          pOVar13[iVar4].p4type = -3;
          pOVar13[iVar4].p4.i = uVar15;
        }
        goto LAB_00155ad9;
      }
      local_58 = sqlite3VdbeAddOp3(p,0x1d,pExpr->iTable,0,p1);
      if (p->db->mallocFailed == '\0') {
        pOVar13 = p->aOp;
        pOVar13[local_58].p4type = -3;
        pOVar13[local_58].p4.i = uVar15;
      }
    }
    if (uVar15 == 1 && local_54 != 0) {
      sqlite3VdbeAddOp3(p,0x33,local_54,destIfFalse,0);
    }
    if (destIfFalse == destIfNull) {
      sqlite3VdbeAddOp3(p,0xb,0,destIfFalse,0);
    }
    if ((local_3c != 0) && (piVar14 = p->pParse->aLabel, piVar14 != (int *)0x0)) {
      piVar14[(int)~local_3c] = p->nOp;
    }
    iVar4 = sqlite3VdbeAddOp3(p,0x24,pExpr->iTable,destIfFalse,0);
    uVar6 = destIfFalse;
    if (1 < (int)uVar15) {
      uVar6 = sqlite3VdbeMakeLabel(p);
    }
    if (0 < (int)uVar15) {
      uVar16 = 0;
      do {
        if (pParse->nTempReg == '\0') {
          iVar7 = pParse->nMem + 1;
          pParse->nMem = iVar7;
        }
        else {
          bVar3 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar3;
          iVar7 = pParse->aTempReg[bVar3];
        }
        pEVar11 = sqlite3VectorFieldSubexpr(local_50,uVar16);
        pCVar10 = sqlite3ExprCollSeq(pParse,pEVar11);
        sqlite3VdbeAddOp3(p,0x5a,pExpr->iTable,uVar16,iVar7);
        iVar8 = sqlite3VdbeAddOp3(p,0x34,p1 + uVar16,uVar6,iVar7);
        sqlite3VdbeChangeP4(p,iVar8,(char *)pCVar10,-2);
        if (iVar7 != 0) {
          bVar3 = pParse->nTempReg;
          if ((ulong)bVar3 < 8) {
            pParse->nTempReg = bVar3 + 1;
            pParse->aTempReg[bVar3] = iVar7;
          }
        }
        uVar16 = uVar16 + 1;
      } while (uVar15 != uVar16);
    }
    sqlite3VdbeAddOp3(p,0xb,0,destIfNull,0);
    if (1 < (int)uVar15) {
      piVar14 = p->pParse->aLabel;
      if (piVar14 != (int *)0x0) {
        piVar14[(int)~uVar6] = p->nOp;
      }
      sqlite3VdbeAddOp3(p,5,pExpr->iTable,iVar4 + 1,0);
      sqlite3VdbeAddOp3(p,0xb,0,destIfFalse,0);
    }
    if (p->db->mallocFailed == '\0') {
      iVar4 = p->nOp + -1;
      if (-1 < local_58) {
        iVar4 = local_58;
      }
      pOVar13 = p->aOp + iVar4;
    }
    else {
      pOVar13 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar13->p2 = p->nOp;
  }
LAB_00155ad9:
  p_00 = local_48;
  if (p1 != 0 && p1 != iVar5) {
    bVar3 = pParse->nTempReg;
    if ((ulong)bVar3 < 8) {
      pParse->nTempReg = bVar3 + 1;
      pParse->aTempReg[bVar3] = p1;
    }
  }
LAB_00155b08:
  if (aiMap != (int *)0x0) {
    sqlite3DbFreeNN(pParse->db,aiMap);
  }
  if (p_00 != (byte *)0x0) {
    sqlite3DbFreeNN(pParse->db,p_00);
  }
  return;
}

Assistant:

static void sqlite3ExprCodeIN(
  Parse *pParse,        /* Parsing and code generating context */
  Expr *pExpr,          /* The IN expression */
  int destIfFalse,      /* Jump here if LHS is not contained in the RHS */
  int destIfNull        /* Jump here if the results are unknown due to NULLs */
){
  int rRhsHasNull = 0;  /* Register that is true if RHS contains NULL values */
  int eType;            /* Type of the RHS */
  int rLhs;             /* Register(s) holding the LHS values */
  int rLhsOrig;         /* LHS values prior to reordering by aiMap[] */
  Vdbe *v;              /* Statement under construction */
  int *aiMap = 0;       /* Map from vector field to index column */
  char *zAff = 0;       /* Affinity string for comparisons */
  int nVector;          /* Size of vectors for this IN operator */
  int iDummy;           /* Dummy parameter to exprCodeVector() */
  Expr *pLeft;          /* The LHS of the IN operator */
  int i;                /* loop counter */
  int destStep2;        /* Where to jump when NULLs seen in step 2 */
  int destStep6 = 0;    /* Start of code for Step 6 */
  int addrTruthOp;      /* Address of opcode that determines the IN is true */
  int destNotNull;      /* Jump here if a comparison is not true in step 6 */
  int addrTop;          /* Top of the step-6 loop */ 

  pLeft = pExpr->pLeft;
  if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
  zAff = exprINAffinity(pParse, pExpr);
  nVector = sqlite3ExprVectorSize(pExpr->pLeft);
  aiMap = (int*)sqlite3DbMallocZero(
      pParse->db, nVector*(sizeof(int) + sizeof(char)) + 1
  );
  if( pParse->db->mallocFailed ) goto sqlite3ExprCodeIN_oom_error;

  /* Attempt to compute the RHS. After this step, if anything other than
  ** IN_INDEX_NOOP is returned, the table opened ith cursor pExpr->iTable 
  ** contains the values that make up the RHS. If IN_INDEX_NOOP is returned,
  ** the RHS has not yet been coded.  */
  v = pParse->pVdbe;
  assert( v!=0 );       /* OOM detected prior to this routine */
  VdbeNoopComment((v, "begin IN expr"));
  eType = sqlite3FindInIndex(pParse, pExpr,
                             IN_INDEX_MEMBERSHIP | IN_INDEX_NOOP_OK,
                             destIfFalse==destIfNull ? 0 : &rRhsHasNull, aiMap);

  assert( pParse->nErr || nVector==1 || eType==IN_INDEX_EPH
       || eType==IN_INDEX_INDEX_ASC || eType==IN_INDEX_INDEX_DESC 
  );
#ifdef SQLITE_DEBUG
  /* Confirm that aiMap[] contains nVector integer values between 0 and
  ** nVector-1. */
  for(i=0; i<nVector; i++){
    int j, cnt;
    for(cnt=j=0; j<nVector; j++) if( aiMap[j]==i ) cnt++;
    assert( cnt==1 );
  }
#endif

  /* Code the LHS, the <expr> from "<expr> IN (...)". If the LHS is a 
  ** vector, then it is stored in an array of nVector registers starting 
  ** at r1.
  **
  ** sqlite3FindInIndex() might have reordered the fields of the LHS vector
  ** so that the fields are in the same order as an existing index.   The
  ** aiMap[] array contains a mapping from the original LHS field order to
  ** the field order that matches the RHS index.
  */
  rLhsOrig = exprCodeVector(pParse, pLeft, &iDummy);
  for(i=0; i<nVector && aiMap[i]==i; i++){} /* Are LHS fields reordered? */
  if( i==nVector ){
    /* LHS fields are not reordered */
    rLhs = rLhsOrig;
  }else{
    /* Need to reorder the LHS fields according to aiMap */
    rLhs = sqlite3GetTempRange(pParse, nVector);
    for(i=0; i<nVector; i++){
      sqlite3VdbeAddOp3(v, OP_Copy, rLhsOrig+i, rLhs+aiMap[i], 0);
    }
  }

  /* If sqlite3FindInIndex() did not find or create an index that is
  ** suitable for evaluating the IN operator, then evaluate using a
  ** sequence of comparisons.
  **
  ** This is step (1) in the in-operator.md optimized algorithm.
  */
  if( eType==IN_INDEX_NOOP ){
    ExprList *pList = pExpr->x.pList;
    CollSeq *pColl = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    int labelOk = sqlite3VdbeMakeLabel(v);
    int r2, regToFree;
    int regCkNull = 0;
    int ii;
    assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
    if( destIfNull!=destIfFalse ){
      regCkNull = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_BitAnd, rLhs, rLhs, regCkNull);
    }
    for(ii=0; ii<pList->nExpr; ii++){
      r2 = sqlite3ExprCodeTemp(pParse, pList->a[ii].pExpr, &regToFree);
      if( regCkNull && sqlite3ExprCanBeNull(pList->a[ii].pExpr) ){
        sqlite3VdbeAddOp3(v, OP_BitAnd, regCkNull, r2, regCkNull);
      }
      if( ii<pList->nExpr-1 || destIfNull!=destIfFalse ){
        sqlite3VdbeAddOp4(v, OP_Eq, rLhs, labelOk, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, ii<pList->nExpr-1);
        VdbeCoverageIf(v, ii==pList->nExpr-1);
        sqlite3VdbeChangeP5(v, zAff[0]);
      }else{
        assert( destIfNull==destIfFalse );
        sqlite3VdbeAddOp4(v, OP_Ne, rLhs, destIfFalse, r2,
                          (void*)pColl, P4_COLLSEQ); VdbeCoverage(v);
        sqlite3VdbeChangeP5(v, zAff[0] | SQLITE_JUMPIFNULL);
      }
      sqlite3ReleaseTempReg(pParse, regToFree);
    }
    if( regCkNull ){
      sqlite3VdbeAddOp2(v, OP_IsNull, regCkNull, destIfNull); VdbeCoverage(v);
      sqlite3VdbeGoto(v, destIfFalse);
    }
    sqlite3VdbeResolveLabel(v, labelOk);
    sqlite3ReleaseTempReg(pParse, regCkNull);
    goto sqlite3ExprCodeIN_finished;
  }

  /* Step 2: Check to see if the LHS contains any NULL columns.  If the
  ** LHS does contain NULLs then the result must be either FALSE or NULL.
  ** We will then skip the binary search of the RHS.
  */
  if( destIfNull==destIfFalse ){
    destStep2 = destIfFalse;
  }else{
    destStep2 = destStep6 = sqlite3VdbeMakeLabel(v);
  }
  for(i=0; i<nVector; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pExpr->pLeft, i);
    if( sqlite3ExprCanBeNull(p) ){
      sqlite3VdbeAddOp2(v, OP_IsNull, rLhs+i, destStep2);
      VdbeCoverage(v);
    }
  }

  /* Step 3.  The LHS is now known to be non-NULL.  Do the binary search
  ** of the RHS using the LHS as a probe.  If found, the result is
  ** true.
  */
  if( eType==IN_INDEX_ROWID ){
    /* In this case, the RHS is the ROWID of table b-tree and so we also
    ** know that the RHS is non-NULL.  Hence, we combine steps 3 and 4
    ** into a single opcode. */
    sqlite3VdbeAddOp3(v, OP_SeekRowid, pExpr->iTable, destIfFalse, rLhs);
    VdbeCoverage(v);
    addrTruthOp = sqlite3VdbeAddOp0(v, OP_Goto);  /* Return True */
  }else{
    sqlite3VdbeAddOp4(v, OP_Affinity, rLhs, nVector, 0, zAff, nVector);
    if( destIfFalse==destIfNull ){
      /* Combine Step 3 and Step 5 into a single opcode */
      sqlite3VdbeAddOp4Int(v, OP_NotFound, pExpr->iTable, destIfFalse,
                           rLhs, nVector); VdbeCoverage(v);
      goto sqlite3ExprCodeIN_finished;
    }
    /* Ordinary Step 3, for the case where FALSE and NULL are distinct */
    addrTruthOp = sqlite3VdbeAddOp4Int(v, OP_Found, pExpr->iTable, 0,
                                      rLhs, nVector); VdbeCoverage(v);
  }

  /* Step 4.  If the RHS is known to be non-NULL and we did not find
  ** an match on the search above, then the result must be FALSE.
  */
  if( rRhsHasNull && nVector==1 ){
    sqlite3VdbeAddOp2(v, OP_NotNull, rRhsHasNull, destIfFalse);
    VdbeCoverage(v);
  }

  /* Step 5.  If we do not care about the difference between NULL and
  ** FALSE, then just return false. 
  */
  if( destIfFalse==destIfNull ) sqlite3VdbeGoto(v, destIfFalse);

  /* Step 6: Loop through rows of the RHS.  Compare each row to the LHS.
  ** If any comparison is NULL, then the result is NULL.  If all
  ** comparisons are FALSE then the final result is FALSE.
  **
  ** For a scalar LHS, it is sufficient to check just the first row
  ** of the RHS.
  */
  if( destStep6 ) sqlite3VdbeResolveLabel(v, destStep6);
  addrTop = sqlite3VdbeAddOp2(v, OP_Rewind, pExpr->iTable, destIfFalse);
  VdbeCoverage(v);
  if( nVector>1 ){
    destNotNull = sqlite3VdbeMakeLabel(v);
  }else{
    /* For nVector==1, combine steps 6 and 7 by immediately returning
    ** FALSE if the first comparison is not NULL */
    destNotNull = destIfFalse;
  }
  for(i=0; i<nVector; i++){
    Expr *p;
    CollSeq *pColl;
    int r3 = sqlite3GetTempReg(pParse);
    p = sqlite3VectorFieldSubexpr(pLeft, i);
    pColl = sqlite3ExprCollSeq(pParse, p);
    sqlite3VdbeAddOp3(v, OP_Column, pExpr->iTable, i, r3);
    sqlite3VdbeAddOp4(v, OP_Ne, rLhs+i, destNotNull, r3,
                      (void*)pColl, P4_COLLSEQ);
    VdbeCoverage(v);
    sqlite3ReleaseTempReg(pParse, r3);
  }
  sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfNull);
  if( nVector>1 ){
    sqlite3VdbeResolveLabel(v, destNotNull);
    sqlite3VdbeAddOp2(v, OP_Next, pExpr->iTable, addrTop+1);
    VdbeCoverage(v);

    /* Step 7:  If we reach this point, we know that the result must
    ** be false. */
    sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfFalse);
  }

  /* Jumps here in order to return true. */
  sqlite3VdbeJumpHere(v, addrTruthOp);

sqlite3ExprCodeIN_finished:
  if( rLhs!=rLhsOrig ) sqlite3ReleaseTempReg(pParse, rLhs);
  VdbeComment((v, "end IN expr"));
sqlite3ExprCodeIN_oom_error:
  sqlite3DbFree(pParse->db, aiMap);
  sqlite3DbFree(pParse->db, zAff);
}